

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-direct-master.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  reference piVar1;
  ostream *poVar2;
  function<bool_(int,_const_diy::Master_&)> *this;
  CoordinateVector ghosts;
  BoolVector wrap;
  BoolVector share_face;
  Master master;
  int rank;
  Bounds domain;
  ContiguousAssigner assigner;
  int nblocks;
  int size;
  communicator world;
  environment env;
  nullptr_t in_stack_ffffffffffffe668;
  value_type_conflict *__x;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_stack_ffffffffffffe670;
  vector<int,_std::allocator<int>_> *this_00;
  Master *this_01;
  _func_void_void_ptr **in_stack_ffffffffffffe678;
  NeverSkip *__f;
  Bounds<int> *in_stack_ffffffffffffe680;
  undefined4 in_stack_ffffffffffffe6a0;
  int iVar3;
  offset_in_Block_to_subr *f;
  Master *this_02;
  vector<int,_std::allocator<int>_> *__x_00;
  vector<int,_std::allocator<int>_> *this_03;
  function<bool_(int,_const_diy::Master_&)> *pfVar4;
  undefined1 __x_01;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffe728;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffe730;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined4 local_1828;
  undefined4 local_1824;
  offset_in_Block_to_subr local_1820 [8];
  vector<int,_std::allocator<int>_> local_17e0 [2];
  undefined8 in_stack_ffffffffffffe850;
  undefined8 in_stack_ffffffffffffe858;
  undefined8 in_stack_ffffffffffffe860;
  undefined8 in_stack_ffffffffffffe868;
  int in_stack_ffffffffffffe870;
  int in_stack_ffffffffffffe874;
  BoolVector *in_stack_ffffffffffffe880;
  code *ghosts_00;
  DivisionsVector *in_stack_ffffffffffffe890;
  communicator local_1728 [237];
  int local_dc;
  undefined4 local_44;
  undefined4 local_40;
  communicator local_30 [2];
  
  diy::mpi::environment::environment
            ((environment *)in_stack_ffffffffffffe670,
             (int)((ulong)in_stack_ffffffffffffe668 >> 0x20),(char **)0x10d5d2);
  diy::mpi::communicator::communicator((communicator *)in_stack_ffffffffffffe670);
  local_40 = 8;
  local_44 = 0x20;
  diy::ContiguousAssigner::Assigner
            ((ContiguousAssigner *)in_stack_ffffffffffffe670,
             (int)((ulong)in_stack_ffffffffffffe668 >> 0x20),(int)in_stack_ffffffffffffe668);
  diy::Bounds<int>::Bounds
            (in_stack_ffffffffffffe680,(int)((ulong)in_stack_ffffffffffffe678 >> 0x20));
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (in_stack_ffffffffffffe670,(size_type)in_stack_ffffffffffffe668);
  *piVar1 = 0;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (in_stack_ffffffffffffe670,(size_type)in_stack_ffffffffffffe668);
  *piVar1 = 0;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (in_stack_ffffffffffffe670,(size_type)in_stack_ffffffffffffe668);
  *piVar1 = 0;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (in_stack_ffffffffffffe670,(size_type)in_stack_ffffffffffffe668);
  *piVar1 = 0xff;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (in_stack_ffffffffffffe670,(size_type)in_stack_ffffffffffffe668);
  *piVar1 = 0xff;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     (in_stack_ffffffffffffe670,(size_type)in_stack_ffffffffffffe668);
  *piVar1 = 0xff;
  local_dc = diy::mpi::communicator::rank(local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,"Rank ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_dc);
  poVar2 = std::operator<<(poVar2,":");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  diy::mpi::communicator::communicator(local_1728,local_30);
  std::function<void*()>::function<void*(*)(),void>
            ((function<void_*()> *)in_stack_ffffffffffffe680,
             (_func_void_ptr **)in_stack_ffffffffffffe678);
  ghosts_00 = Block::destroy;
  std::function<void(void*)>::function<void(*)(void*),void>
            ((function<void_(void_*)> *)in_stack_ffffffffffffe680,in_stack_ffffffffffffe678);
  this_03 = (vector<int,_std::allocator<int>_> *)0x0;
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe670,
             in_stack_ffffffffffffe668);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
            ((function<void_(void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe670,
             in_stack_ffffffffffffe668);
  this = (function<bool_(int,_const_diy::Master_&)> *)operator_new(0x10);
  diy::Master::QueueSizePolicy::QueueSizePolicy
            ((QueueSizePolicy *)in_stack_ffffffffffffe670,(size_t)in_stack_ffffffffffffe668);
  this_00 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe868;
  __x = (value_type_conflict *)0x0;
  pfVar4 = this;
  diy::Master::Master((Master *)master.mt_gen._M_x[0x13c],(communicator *)master.mt_gen._M_x[0x13b],
                      master.mt_gen._M_x[0x13a]._4_4_,(int)master.mt_gen._M_x[0x13a],
                      (CreateBlock *)master.mt_gen._M_x[0x139],
                      (DestroyBlock *)master.mt_gen._M_x[0x138],
                      (ExternalStorage *)master.mt_gen._M_x[0x13e],
                      (SaveBlock *)master.mt_gen._M_x[0x13f],(LoadBlock *)master.mt_gen._M_x[0x140],
                      (QueuePolicy *)master.mt_gen._M_x[0x141]);
  __x_01 = (undefined1)((ulong)pfVar4 >> 0x38);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x10d8b5);
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x10d8c2);
  std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x10d8cf);
  std::function<void_*()>::~function((function<void_*()> *)0x10d8dc);
  diy::mpi::communicator::~communicator((communicator *)0x10d8e9);
  __x_00 = local_17e0;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x10d8fb);
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)poVar2,(bool)__x_01);
  this_02 = (Master *)(local_1820 + 3);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x10d91e);
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)poVar2,(bool)__x_01);
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)poVar2,(bool)__x_01);
  f = local_1820;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10d955);
  local_1824 = 1;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
  local_1828 = 2;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
  iVar3 = local_dc;
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_ffffffffffffe730,in_stack_ffffffffffffe728);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_ffffffffffffe730,in_stack_ffffffffffffe728);
  std::vector<int,_std::allocator<int>_>::vector(this_03,__x_00);
  local_18a8 = 0;
  uStack_18a0 = 0;
  local_1898 = 0;
  __f = (NeverSkip *)&local_18a8;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10da0f);
  this_01 = (Master *)&stack0xffffffffffffe770;
  diy::decompose<diy::Bounds<int>>
            (in_stack_ffffffffffffe874,in_stack_ffffffffffffe870,
             (Bounds<int> *)in_stack_ffffffffffffe868,(StaticAssigner *)in_stack_ffffffffffffe860,
             (Master *)in_stack_ffffffffffffe858,(BoolVector *)in_stack_ffffffffffffe850,
             in_stack_ffffffffffffe880,(CoordinateVector *)ghosts_00,in_stack_ffffffffffffe890);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x10da89)
  ;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x10da96)
  ;
  std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>(this,__f);
  diy::Master::foreach<void(Block::*)(diy::Master::ProxyWithLink_const&)>
            (this_02,f,(Skip *)CONCAT44(iVar3,in_stack_ffffffffffffe6a0));
  std::function<bool_(int,_const_diy::Master_&)>::~function
            ((function<bool_(int,_const_diy::Master_&)> *)0x10daf4);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x10db0e)
  ;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x10db1b)
  ;
  diy::Master::~Master(this_01);
  diy::Bounds<int>::~Bounds((Bounds<int> *)this_01);
  diy::ContiguousAssigner::~ContiguousAssigner((ContiguousAssigner *)0x10db42);
  diy::mpi::communicator::~communicator((communicator *)0x10db4f);
  diy::mpi::environment::~environment((environment *)0x10db5c);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  int                       size    = 8;
  int                       nblocks = 32;
  diy::ContiguousAssigner   assigner(size, nblocks);
  //diy::RoundRobinAssigner   assigner(size, nblocks);

  Bounds domain(3);
  domain.min[0] = domain.min[1] = domain.min[2] = 0;
  domain.max[0] = domain.max[1] = domain.max[2] = 255;
  //domain.max[0] = domain.max[1] = domain.max[2] = 128;

  int rank = world.rank();
  std::cout << "Rank " << rank << ":" << std::endl;
  diy::Master master(world, 1, -1, &Block::create, &Block::destroy);

  diy::RegularDecomposer<Bounds>::BoolVector          share_face;
  share_face.push_back(true);
  diy::RegularDecomposer<Bounds>::BoolVector          wrap;
  wrap.push_back(true);
  wrap.push_back(true);
  diy::RegularDecomposer<Bounds>::CoordinateVector    ghosts;
  ghosts.push_back(1); ghosts.push_back(2);
  diy::decompose(3, rank, domain, assigner, master, share_face, wrap, ghosts);

  master.foreach(&Block::show_link);
}